

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleNearest3D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,float v,float w,
          IVec3 *offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  int iVar5;
  deInt32 dVar6;
  int iVar7;
  deInt32 dVar8;
  int iVar9;
  deBool dVar10;
  TextureFormat *format;
  undefined1 auVar12 [12];
  undefined8 uVar13;
  Vec4 VVar11;
  int k;
  int j;
  int i;
  int z;
  int y;
  int x;
  int depth;
  int height;
  int width;
  IVec3 *offset_local;
  float w_local;
  float v_local;
  float u_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  iVar1 = ConstPixelBufferAccess::getWidth(access);
  iVar2 = ConstPixelBufferAccess::getHeight(access);
  iVar3 = ConstPixelBufferAccess::getDepth(access);
  dVar4 = deFloorFloatToInt32(u);
  iVar5 = Vector<int,_3>::x(offset);
  dVar6 = deFloorFloatToInt32(v);
  iVar7 = Vector<int,_3>::y(offset);
  dVar8 = deFloorFloatToInt32(w);
  iVar9 = Vector<int,_3>::z(offset);
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    dVar10 = deInBounds32(dVar4 + iVar5,0,iVar1);
    if (dVar10 != 0) goto LAB_00e8da61;
LAB_00e8da99:
    format = ConstPixelBufferAccess::getFormat(access);
    VVar11 = lookupBorder(this,format,sampler);
  }
  else {
LAB_00e8da61:
    if (sampler->wrapT == CLAMP_TO_BORDER) {
      dVar10 = deInBounds32(dVar6 + iVar7,0,iVar2);
      if (dVar10 == 0) goto LAB_00e8da99;
    }
    if (sampler->wrapR == CLAMP_TO_BORDER) {
      dVar10 = deInBounds32(dVar8 + iVar9,0,iVar3);
      if (dVar10 == 0) goto LAB_00e8da99;
    }
    iVar1 = wrap(sampler->wrapS,dVar4 + iVar5,iVar1);
    iVar2 = wrap(sampler->wrapT,dVar6 + iVar7,iVar2);
    iVar3 = wrap(sampler->wrapR,dVar8 + iVar9,iVar3);
    VVar11 = lookup(this,access,iVar1,iVar2,iVar3);
  }
  VVar11.m_data[0] = VVar11.m_data[0];
  auVar12._4_4_ = VVar11.m_data[1];
  register0x00001240 = VVar11.m_data[2];
  register0x00001244 = VVar11.m_data[3];
  return (Vec4)VVar11.m_data;
}

Assistant:

static Vec4 sampleNearest3D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, float v, float w, const IVec3& offset)
{
	int width	= access.getWidth();
	int height	= access.getHeight();
	int depth	= access.getDepth();

	int x = deFloorFloatToInt32(u)+offset.x();
	int y = deFloorFloatToInt32(v)+offset.y();
	int z = deFloorFloatToInt32(w)+offset.z();

	// Check for CLAMP_TO_BORDER.
	if ((sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width))	||
		(sampler.wrapT == Sampler::CLAMP_TO_BORDER && !deInBounds32(y, 0, height))	||
		(sampler.wrapR == Sampler::CLAMP_TO_BORDER && !deInBounds32(z, 0, depth)))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);
	int j = wrap(sampler.wrapT, y, height);
	int k = wrap(sampler.wrapR, z, depth);

	return lookup(access, i, j, k);
}